

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  pointer pbVar1;
  deUint32 format;
  deUint32 dataType;
  TestContext *pTVar2;
  RenderContext *pRVar3;
  Context *pCVar4;
  ContextInfo *renderCtxInfo;
  int extraout_EAX;
  char *__s;
  long *plVar5;
  Texture2DFormatCase *pTVar6;
  TextureCubeFormatCase *pTVar7;
  Compressed2DFormatCase *pCVar8;
  undefined8 *puVar9;
  CompressedCubeFormatCase *pCVar10;
  long *plVar11;
  size_type *psVar12;
  int iVar13;
  long lVar14;
  pointer pbVar15;
  pointer *ppbVar16;
  char *__end;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  string descriptionBase;
  pointer *local_230;
  long local_228;
  pointer local_220 [2];
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  string nameBase;
  ios_base local_138 [264];
  
  lVar14 = 0;
  do {
    ppbVar16 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    format = *(deUint32 *)((long)&DAT_0078cb38 + lVar14);
    dataType = *(deUint32 *)((long)&DAT_0078cb3c + lVar14);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)&DAT_0078cb30 + lVar14),
               (allocator<char> *)&descriptionBase);
    __s = glu::getTextureFormatName(format);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npotFilenames,__s,(allocator<char> *)&local_210);
    plVar5 = (long *)std::__cxx11::string::append((char *)&npotFilenames);
    plVar11 = plVar5 + 2;
    if ((long *)*plVar5 == plVar11) {
      local_298 = *plVar11;
      lStack_290 = plVar5[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar11;
      local_2a8 = (long *)*plVar5;
    }
    local_2a0 = plVar5[1];
    *plVar5 = (long)plVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    glu::getTypeName(dataType);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
    psVar12 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar12) {
      descriptionBase.field_2._M_allocated_capacity = *psVar12;
      descriptionBase.field_2._8_8_ = plVar5[3];
    }
    else {
      descriptionBase.field_2._M_allocated_capacity = *psVar12;
      descriptionBase._M_dataplus._M_p = (pointer)*plVar5;
    }
    descriptionBase._M_string_length = plVar5[1];
    *plVar5 = (long)psVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    local_1f0 = lVar14;
    pTVar6 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2a8 = &local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2a8);
    plVar5 = local_2a8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar6,pTVar2,pRVar3,(char *)plVar5,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,format,dataType,0x80,0x80);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
    ppbVar16 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    pTVar6 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2a8 = &local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2a8);
    plVar5 = local_2a8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar6,pTVar2,pRVar3,(char *)plVar5,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,format,dataType,0x3f,0x70);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
    ppbVar16 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2a8 = &local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2a8);
    plVar5 = local_2a8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar2,pRVar3,(char *)plVar5,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,format,dataType,0x40,0x40);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
    ppbVar16 = &npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar3 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    local_2a8 = &local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,nameBase._M_dataplus._M_p,
               nameBase._M_dataplus._M_p + nameBase._M_string_length);
    std::__cxx11::string::append((char *)&local_2a8);
    plVar5 = local_2a8;
    npotFilenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&npotFilenames,descriptionBase._M_dataplus._M_p,
               descriptionBase._M_dataplus._M_p + descriptionBase._M_string_length);
    std::__cxx11::string::append((char *)&npotFilenames);
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar2,pRVar3,(char *)plVar5,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,format,dataType,0x39,0x39);
    iVar13 = (int)plVar5;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
    lVar14 = local_1f0;
    if (npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((npotFilenames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x80);
  pCVar8 = (Compressed2DFormatCase *)operator_new(0xf8);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar4 = (this->super_TestCaseGroup).m_context;
  pRVar3 = pCVar4->m_renderCtx;
  renderCtxInfo = pCVar4->m_contextInfo;
  toStringVector_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nameBase,(Functional *)init::filenames,(char **)0x8,iVar13);
  Compressed2DFormatCase::Compressed2DFormatCase
            (pCVar8,pTVar2,pRVar3,renderCtxInfo,"etc1_2d_pot","GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nameBase);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&nameBase);
  descriptionBase._M_dataplus._M_p = (pointer)0x0;
  descriptionBase._M_string_length = 0;
  descriptionBase.field_2._M_allocated_capacity = 0;
  nameBase._M_dataplus._M_p = (pointer)&nameBase.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nameBase,"data/etc1/photo_helsinki_113x89.pkm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&descriptionBase,
             &nameBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
    operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
  }
  pCVar8 = (Compressed2DFormatCase *)operator_new(0xf8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  Compressed2DFormatCase::Compressed2DFormatCase
            (pCVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar4->m_renderCtx,pCVar4->m_contextInfo,"etc1_2d_npot",
             "GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&descriptionBase);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&descriptionBase);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar13 = 0;
  do {
    lVar14 = 0;
    do {
      local_1e8[0] = local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"data/etc1/skybox_","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_1e8);
      plVar11 = plVar5 + 2;
      if ((long *)*plVar5 == plVar11) {
        local_200 = *plVar11;
        lStack_1f8 = plVar5[3];
        local_210 = &local_200;
      }
      else {
        local_200 = *plVar11;
        local_210 = (long *)*plVar5;
      }
      local_208 = plVar5[1];
      *plVar5 = (long)plVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&npotFilenames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar15 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pbVar15) {
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar15->_M_dataplus)._M_p;
      }
      else {
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar15->_M_dataplus)._M_p;
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
      }
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
      *plVar5 = (long)pbVar15;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&nameBase);
      std::ostream::operator<<(&nameBase,iVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nameBase);
      std::ios_base::~ios_base(local_138);
      pbVar15 = (pointer)0xf;
      if (npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&npotFilenames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pbVar15 = npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      pbVar1 = (pointer)((long)&((npotFilenames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                        local_228);
      if (pbVar15 < pbVar1) {
        pbVar15 = (pointer)0xf;
        if (local_230 != local_220) {
          pbVar15 = local_220[0];
        }
        if (pbVar15 < pbVar1) goto LAB_003487bb;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_230,0,(char *)0x0,
                            (ulong)npotFilenames.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
LAB_003487bb:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&npotFilenames,(ulong)local_230);
      }
      local_2a8 = &local_298;
      plVar5 = puVar9 + 2;
      if ((long *)*puVar9 == plVar5) {
        local_298 = *plVar5;
        lStack_290 = puVar9[3];
      }
      else {
        local_298 = *plVar5;
        local_2a8 = (long *)*puVar9;
      }
      local_2a0 = puVar9[1];
      *puVar9 = plVar5;
      puVar9[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
      psVar12 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar12) {
        descriptionBase.field_2._M_allocated_capacity = *psVar12;
        descriptionBase.field_2._8_8_ = plVar5[3];
      }
      else {
        descriptionBase.field_2._M_allocated_capacity = *psVar12;
        descriptionBase._M_dataplus._M_p = (pointer)*plVar5;
      }
      descriptionBase._M_string_length = plVar5[1];
      *plVar5 = (long)psVar12;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
                 &descriptionBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
        operator_delete(descriptionBase._M_dataplus._M_p,
                        descriptionBase.field_2._M_allocated_capacity + 1);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_230 != local_220) {
        operator_delete(local_230,(ulong)((long)&(local_220[0]->_M_dataplus)._M_p + 1));
      }
      if (npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&npotFilenames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(npotFilenames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((npotFilenames.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x30);
    iVar13 = iVar13 + 1;
    if (iVar13 == 7) {
      pCVar10 = (CompressedCubeFormatCase *)operator_new(0x100);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      CompressedCubeFormatCase::CompressedCubeFormatCase
                (pCVar10,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pCVar4->m_renderCtx,pCVar4->m_contextInfo,"etc1_cube_pot",
                 "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP",&potFilenames);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar10);
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      npotFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar14 = 0;
      do {
        local_2a8 = &local_298;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,"data/etc1/skybox_61x61_","");
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
        descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
        psVar12 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar12) {
          descriptionBase.field_2._M_allocated_capacity = *psVar12;
          descriptionBase.field_2._8_8_ = plVar5[3];
        }
        else {
          descriptionBase.field_2._M_allocated_capacity = *psVar12;
          descriptionBase._M_dataplus._M_p = (pointer)*plVar5;
        }
        descriptionBase._M_string_length = plVar5[1];
        *plVar5 = (long)psVar12;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&descriptionBase);
        nameBase._M_dataplus._M_p = (pointer)&nameBase.field_2;
        psVar12 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar12) {
          nameBase.field_2._M_allocated_capacity = *psVar12;
          nameBase.field_2._8_8_ = plVar5[3];
        }
        else {
          nameBase.field_2._M_allocated_capacity = *psVar12;
          nameBase._M_dataplus._M_p = (pointer)*plVar5;
        }
        nameBase._M_string_length = plVar5[1];
        *plVar5 = (long)psVar12;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &npotFilenames,&nameBase);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameBase._M_dataplus._M_p != &nameBase.field_2) {
          operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
          operator_delete(descriptionBase._M_dataplus._M_p,
                          descriptionBase.field_2._M_allocated_capacity + 1);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8,local_298 + 1);
        }
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x30);
      pCVar10 = (CompressedCubeFormatCase *)operator_new(0x100);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      CompressedCubeFormatCase::CompressedCubeFormatCase
                (pCVar10,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pCVar4->m_renderCtx,pCVar4->m_contextInfo,"etc1_cube_npot",
                 "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP",&npotFilenames);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&npotFilenames);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&potFilenames);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void TextureFormatTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32		format;
		deUint32		dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		addChild(new Texture2DFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType, 128, 128));
		addChild(new Texture2DFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType,  63, 112));
		addChild(new TextureCubeFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  64,  64));
		addChild(new TextureCubeFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  57,  57));
	}

	// ETC-1 compressed formats.
	{
		static const char* filenames[] =
		{
			"data/etc1/photo_helsinki_mip_0.pkm",
			"data/etc1/photo_helsinki_mip_1.pkm",
			"data/etc1/photo_helsinki_mip_2.pkm",
			"data/etc1/photo_helsinki_mip_3.pkm",
			"data/etc1/photo_helsinki_mip_4.pkm",
			"data/etc1/photo_helsinki_mip_5.pkm",
			"data/etc1/photo_helsinki_mip_6.pkm",
			"data/etc1/photo_helsinki_mip_7.pkm"
		};
		addChild(new Compressed2DFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", toStringVector(filenames, DE_LENGTH_OF_ARRAY(filenames))));
	}

	{
		vector<string> filenames;
		filenames.push_back("data/etc1/photo_helsinki_113x89.pkm");
		addChild(new Compressed2DFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_npot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", filenames));
	}

	{
		static const char* faceExt[] = { "neg_x", "pos_x", "neg_y", "pos_y", "neg_z", "pos_z" };

		const int		potNumLevels	= 7;
		vector<string>	potFilenames;
		for (int level = 0; level < potNumLevels; level++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				potFilenames.push_back(string("data/etc1/skybox_") + faceExt[face] + "_mip_" + de::toString(level) + ".pkm");

		addChild(new CompressedCubeFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP", potFilenames));

		vector<string> npotFilenames;
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			npotFilenames.push_back(string("data/etc1/skybox_61x61_") + faceExt[face] + ".pkm");

		addChild(new CompressedCubeFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_npot", "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP", npotFilenames));
	}
}